

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  float d;
  float c;
  float b;
  float a;
  char **argv_local;
  int argc_local;
  
  printf("%.2f, %.2f, %.2f\n",0xbff3333340000000,0x3fc99999a0000000,0x3fe3333340000000);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  float a = 0.2;
  float b = 0.6;
  float c = -1.2;

  {
    float d = c;
    c = b;
    b = a;
    a = d;
  }
  printf("%.2f, %.2f, %.2f\n", a, b, c);

  return 0;
}